

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::ip_filter_updated(torrent *this)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  pointer this_00;
  element_type *filter;
  alert_manager *paVar2;
  reason_t local_138;
  basic_endpoint<boost::asio::ip::tcp> local_134;
  undefined1 local_118 [24];
  address *addr;
  iterator __end3;
  iterator __begin3;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *__range3;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> banned;
  torrent_state st;
  torrent *this_local;
  
  if ((((*(uint *)&this->field_0x5d8 >> 0x19 & 1) != 0) &&
      (st.erased.
       super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this,
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list), bVar1)) &&
     (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter), bVar1)
     ) {
    __return_storage_ptr__ =
         &banned.
          super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    get_peer_list_state((torrent_state *)__return_storage_ptr__,this);
    ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               &stack0xffffffffffffff28);
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    filter = ::std::
             __shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_ip_filter);
    peer_list::apply_ip_filter
              (this_00,filter,(torrent_state *)__return_storage_ptr__,
               (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               &stack0xffffffffffffff28);
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::peer_blocked_alert>(paVar2);
    if (bVar1) {
      __end3 = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
               begin((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                     &stack0xffffffffffffff28);
      addr = (address *)
             ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::end
                       ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                         *)&stack0xffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                                         *)&addr), bVar1) {
        local_118._16_8_ =
             __gnu_cxx::
             __normal_iterator<boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
             ::operator*(&__end3);
        paVar2 = alerts(this);
        get_handle((torrent *)local_118);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                  (&local_134,(address *)local_118._16_8_,0);
        local_138 = ip_filter;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::peer_blocked_alert::reason_t>
                  (paVar2,(torrent_handle *)local_118,&local_134,&local_138);
        torrent_handle::~torrent_handle((torrent_handle *)local_118);
        __gnu_cxx::
        __normal_iterator<boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
        ::operator++(&__end3);
      }
    }
    peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&st.port);
    ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::~vector
              ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               &stack0xffffffffffffff28);
    torrent_state::~torrent_state
              ((torrent_state *)
               &banned.
                super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void torrent::ip_filter_updated()
	{
		if (!m_apply_ip_filter) return;
		if (!m_peer_list) return;
		if (!m_ip_filter) return;

		torrent_state st = get_peer_list_state();
		std::vector<address> banned;
		m_peer_list->apply_ip_filter(*m_ip_filter, &st, banned);

		if (alerts().should_post<peer_blocked_alert>())
		{
			for (auto const& addr : banned)
				alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, tcp::endpoint(addr, 0)
					, peer_blocked_alert::ip_filter);
		}

		peers_erased(st.erased);
	}